

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptGenerator.cpp
# Opt level: O2

Var __thiscall
Js::JavascriptGenerator::CallGenerator
          (JavascriptGenerator *this,Var data,ResumeYieldKind resumeKind)

{
  ScriptContext *pSVar1;
  JavascriptLibrary *this_00;
  InterpreterStackFrame *this_01;
  ThreadContext *pTVar2;
  ScriptFunction *this_02;
  code *pcVar3;
  bool bVar4;
  uint uVar5;
  RegSlot RVar6;
  undefined4 *puVar7;
  FunctionBody *pFVar8;
  Var aValue;
  JavascriptMethod entryPoint;
  DynamicObject *value;
  uint32 i;
  uint32 index;
  Arguments local_88;
  JavascriptGenerator *local_78;
  Var thunkArgs [2];
  undefined1 local_60 [8];
  GeneratorStateHelper helper;
  
  if ((this->state & ~Suspended) == Executing) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar7 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptGenerator.cpp"
                                ,0xa9,"(!IsExecuting() && !IsCompleted())",
                                "!IsExecuting() && !IsCompleted()");
    if (!bVar4) {
      pcVar3 = (code *)invalidInstructionException();
      (*pcVar3)();
    }
    *puVar7 = 0;
  }
  pSVar1 = (((((this->super_DynamicObject).super_RecyclableObject.type.ptr)->javascriptLibrary).ptr)
           ->super_JavascriptLibraryBase).scriptContext.ptr;
  this_00 = (pSVar1->super_ScriptContextBase).javascriptLibrary;
  helper._8_8_ = data;
  if ((this->frame).ptr != (InterpreterStackFrame *)0x0) {
    pFVar8 = JavascriptFunction::GetFunctionBody((JavascriptFunction *)(this->scriptFunction).ptr);
    uVar5 = FunctionBody::GetInnerScopeCount(pFVar8);
    for (index = 0; uVar5 != index; index = index + 1) {
      pFVar8 = JavascriptFunction::GetFunctionBody((JavascriptFunction *)(this->scriptFunction).ptr)
      ;
      RVar6 = FunctionBody::GetFirstInnerScopeRegister(pFVar8);
      this_01 = (this->frame).ptr;
      aValue = InterpreterStackFrame::InnerScopeFromIndex(this_01,index);
      InterpreterStackFrame::SetNonVarReg(this_01,RVar6 + index,aValue);
    }
  }
  SetResumeYieldProperties(this,(Var)helper._8_8_,resumeKind);
  thunkArgs[0] = (this->resumeYieldObject).ptr;
  helper.generator._0_1_ = 1;
  this->state = Executing;
  pTVar2 = pSVar1->threadContext;
  bVar4 = pTVar2->reentrancySafeOrHandled;
  pTVar2->reentrancySafeOrHandled = true;
  this_02 = (this->scriptFunction).ptr;
  local_78 = this;
  local_60 = (undefined1  [8])this;
  entryPoint = RecyclableObject::GetEntryPoint((RecyclableObject *)this_02);
  local_88.Info = (Type)0x2;
  local_88.Values = &local_78;
  value = (DynamicObject *)
          JavascriptFunction::CallFunction<true>
                    ((RecyclableObject *)this_02,entryPoint,&local_88,false);
  pTVar2->reentrancySafeOrHandled = bVar4;
  helper.generator._0_1_ = 0;
  anon_unknown.dwarf_72914c1::GeneratorStateHelper::~GeneratorStateHelper
            ((GeneratorStateHelper *)local_60);
  SetResumeYieldProperties(this,(this_00->super_JavascriptLibraryBase).undefinedValue.ptr,Normal);
  if (this->state == Completed) {
    value = JavascriptLibrary::CreateIteratorResultObject
                      (this_00,value,(this_00->super_JavascriptLibraryBase).booleanTrue.ptr);
  }
  return value;
}

Assistant:

Var JavascriptGenerator::CallGenerator(Var data, ResumeYieldKind resumeKind)
{
    Assert(!IsExecuting() && !IsCompleted());

    ScriptContext* scriptContext = this->GetScriptContext();
    JavascriptLibrary* library = scriptContext->GetLibrary();
    Var result = nullptr;

    if (this->frame)
    {
        // if the function already has a state it may be going to resume in the jit
        // if so copy any innerScopes into registers jit can access
        uint32 innerScopeCount = this->scriptFunction->GetFunctionBody()->GetInnerScopeCount();
        for (uint32 i = 0; i < innerScopeCount; ++i)
        {
            Js::RegSlot reg = this->scriptFunction->GetFunctionBody()->GetFirstInnerScopeRegister() + i;
            this->frame->SetNonVarReg(reg, this->frame->InnerScopeFromIndex(i));
        }
    }

    SetResumeYieldProperties(data, resumeKind);

    {
        Var thunkArgs[] = {this, this->resumeYieldObject};
        Arguments arguments(_countof(thunkArgs), thunkArgs);
        GeneratorStateHelper helper(this);

        try
        {
            BEGIN_SAFE_REENTRANT_CALL(scriptContext->GetThreadContext())
            {
                result = JavascriptFunction::CallFunction<1>(
                    this->scriptFunction,
                    this->scriptFunction->GetEntryPoint(),
                    arguments);
            }
            END_SAFE_REENTRANT_CALL
            helper.didThrow = false;
        }
        catch (const JavascriptException& err)
        {
            JavascriptExceptionOperators::DoThrowCheckClone(err.GetAndClear(), scriptContext);
        }
    }

    // Clear the value property of the resume yield object so that we don't
    // extend the lifetime of the value
    SetResumeYieldProperties(library->GetUndefined(), ResumeYieldKind::Normal);

    if (IsCompleted())
        return library->CreateIteratorResultObject(result, library->GetTrue());

    return result;
}